

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O0

void lqMapOverAllOutsideObjects
               (lqInternalDB *lq,float x,float y,float z,float radius,lqCallBackFunction func,
               void *clientQueryState)

{
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float distanceSquared;
  float dz;
  float dy;
  float dx;
  float radiusSquared;
  lqClientProxy *co;
  undefined8 local_30;
  
  for (local_30 = *(long *)(in_RDI + 0x30); local_30 != 0; local_30 = *(long *)(local_30 + 8)) {
    fVar1 = in_XMM0_Da - *(float *)(local_30 + 0x20);
    fVar2 = in_XMM1_Da - *(float *)(local_30 + 0x24);
    fVar3 = in_XMM2_Da - *(float *)(local_30 + 0x28);
    fVar1 = fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2;
    if (fVar1 < in_XMM3_Da * in_XMM3_Da) {
      (*in_RSI)(fVar1,*(undefined8 *)(local_30 + 0x18),in_RDX);
    }
  }
  return;
}

Assistant:

void lqMapOverAllOutsideObjects (lqInternalDB* lq, 
				 float x, float y, float z,
				 float radius,
				 lqCallBackFunction func,
				 void* clientQueryState)
{
    lqClientProxy* co = lq->other;
    float radiusSquared = radius * radius;

    /* traverse the "other" bin's client object list */
    lqTraverseBinClientObjectList (co,
				   radiusSquared,
				   func,
				   clientQueryState);
}